

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_tests.cpp
# Opt level: O2

void mempool_tests::MempoolRemoveTest_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  pointer local_6e8;
  pointer local_6e0;
  char *local_6d8;
  char *local_6d0;
  pointer local_6c8;
  pointer local_6c0;
  char *local_6b8;
  char *local_6b0;
  pointer local_6a8;
  pointer local_6a0;
  char *local_698;
  char *local_690;
  pointer local_688;
  pointer local_680;
  char *local_678;
  char *local_670;
  pointer local_668;
  pointer local_660;
  char *local_658;
  char *local_650;
  basic_wrap_stringstream<char> local_648;
  MempoolRemoveTest t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_658 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/mempool_tests.cpp"
  ;
  local_650 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"MempoolRemoveTest");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_668 = (pbVar3->_M_dataplus)._M_p;
  local_660 = local_668 + pbVar3->_M_string_length;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = &DAT_0000001a;
  file.m_begin = (iterator)&local_658;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_668,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  MempoolRemoveTest::MempoolRemoveTest(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/mempool_tests.cpp"
  ;
  local_670 = "";
  memset(&local_648,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_648);
  std::operator<<((ostream *)&local_648,'\"');
  std::operator<<((ostream *)&local_648,"MempoolRemoveTest");
  std::operator<<((ostream *)&local_648,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_648);
  local_688 = (pbVar3->_M_dataplus)._M_p;
  local_680 = local_688 + pbVar3->_M_string_length;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = &DAT_0000001a;
  file_00.m_begin = (iterator)&local_678;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_688,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_648);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/mempool_tests.cpp"
  ;
  local_690 = "";
  memset(&local_648,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_648);
  std::operator<<((ostream *)&local_648,'\"');
  std::operator<<((ostream *)&local_648,"MempoolRemoveTest");
  std::operator<<((ostream *)&local_648,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_648);
  local_6a8 = (pbVar3->_M_dataplus)._M_p;
  local_6a0 = local_6a8 + pbVar3->_M_string_length;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  file_01.m_end = &DAT_0000001a;
  file_01.m_begin = (iterator)&local_698;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_6a8,msg_01);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_648);
  MempoolRemoveTest::test_method(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/mempool_tests.cpp"
  ;
  local_6b0 = "";
  memset(&local_648,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_648);
  std::operator<<((ostream *)&local_648,'\"');
  std::operator<<((ostream *)&local_648,"MempoolRemoveTest");
  std::operator<<((ostream *)&local_648,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_648);
  local_6c8 = (pbVar3->_M_dataplus)._M_p;
  local_6c0 = local_6c8 + pbVar3->_M_string_length;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  file_02.m_end = &DAT_0000001a;
  file_02.m_begin = (iterator)&local_6b8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_6c8,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_648);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/mempool_tests.cpp"
  ;
  local_6d0 = "";
  memset(&local_648,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_648);
  std::operator<<((ostream *)&local_648,'\"');
  std::operator<<((ostream *)&local_648,"MempoolRemoveTest");
  std::operator<<((ostream *)&local_648,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_648);
  local_6e8 = (pbVar3->_M_dataplus)._M_p;
  local_6e0 = local_6e8 + pbVar3->_M_string_length;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  file_03.m_end = &DAT_0000001a;
  file_03.m_begin = (iterator)&local_6d8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_6e8,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_648);
  ChainTestingSetup::~ChainTestingSetup((ChainTestingSetup *)&t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(MempoolRemoveTest)
{
    // Test CTxMemPool::remove functionality

    TestMemPoolEntryHelper entry;
    // Parent transaction with three children,
    // and three grand-children:
    CMutableTransaction txParent;
    txParent.vin.resize(1);
    txParent.vin[0].scriptSig = CScript() << OP_11;
    txParent.vout.resize(3);
    for (int i = 0; i < 3; i++)
    {
        txParent.vout[i].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
        txParent.vout[i].nValue = 33000LL;
    }
    CMutableTransaction txChild[3];
    for (int i = 0; i < 3; i++)
    {
        txChild[i].vin.resize(1);
        txChild[i].vin[0].scriptSig = CScript() << OP_11;
        txChild[i].vin[0].prevout.hash = txParent.GetHash();
        txChild[i].vin[0].prevout.n = i;
        txChild[i].vout.resize(1);
        txChild[i].vout[0].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
        txChild[i].vout[0].nValue = 11000LL;
    }
    CMutableTransaction txGrandChild[3];
    for (int i = 0; i < 3; i++)
    {
        txGrandChild[i].vin.resize(1);
        txGrandChild[i].vin[0].scriptSig = CScript() << OP_11;
        txGrandChild[i].vin[0].prevout.hash = txChild[i].GetHash();
        txGrandChild[i].vin[0].prevout.n = 0;
        txGrandChild[i].vout.resize(1);
        txGrandChild[i].vout[0].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
        txGrandChild[i].vout[0].nValue = 11000LL;
    }


    CTxMemPool& testPool = *Assert(m_node.mempool);
    LOCK2(::cs_main, testPool.cs);

    // Nothing in pool, remove should do nothing:
    unsigned int poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txParent), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize);

    // Just the parent:
    testPool.addUnchecked(entry.FromTx(txParent));
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txParent), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize - 1);

    // Parent, children, grandchildren:
    testPool.addUnchecked(entry.FromTx(txParent));
    for (int i = 0; i < 3; i++)
    {
        testPool.addUnchecked(entry.FromTx(txChild[i]));
        testPool.addUnchecked(entry.FromTx(txGrandChild[i]));
    }
    // Remove Child[0], GrandChild[0] should be removed:
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txChild[0]), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize - 2);
    // ... make sure grandchild and child are gone:
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txGrandChild[0]), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize);
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txChild[0]), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize);
    // Remove parent, all children/grandchildren should go:
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txParent), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize - 5);
    BOOST_CHECK_EQUAL(testPool.size(), 0U);

    // Add children and grandchildren, but NOT the parent (simulate the parent being in a block)
    for (int i = 0; i < 3; i++)
    {
        testPool.addUnchecked(entry.FromTx(txChild[i]));
        testPool.addUnchecked(entry.FromTx(txGrandChild[i]));
    }
    // Now remove the parent, as might happen if a block-re-org occurs but the parent cannot be
    // put into the mempool (maybe because it is non-standard):
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txParent), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize - 6);
    BOOST_CHECK_EQUAL(testPool.size(), 0U);
}